

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.hh
# Opt level: O3

void __thiscall
tchecker::algorithms::couvscc::
generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::couv_dfs
          (generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>
           *this,node_sptr_t *n,zg_t *ts,graph_t *graph,
          dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *labels,stats_t *stats)

{
  todo_stack_entry_t *ptVar1;
  uint *puVar2;
  bool *pbVar3;
  _Elt_pointer prVar4;
  _Elt_pointer ptVar5;
  node_sptr_t t;
  node_sptr_t local_40;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *local_38;
  
  local_38 = labels;
  push(this,n,ts,graph,stats);
  ptVar5 = (this->_todo).c.
           super__Deque_base<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::todo_stack_entry_t,_std::allocator<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::todo_stack_entry_t>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ptVar5 != (this->_todo).c.
                super__Deque_base<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::todo_stack_entry_t,_std::allocator<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::todo_stack_entry_t>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      if (ptVar5 == (this->_todo).c.
                    super__Deque_base<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::todo_stack_entry_t,_std::allocator<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::todo_stack_entry_t>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        ptVar1 = (this->_todo).c.
                 super__Deque_base<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::todo_stack_entry_t,_std::allocator<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::todo_stack_entry_t>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        if (ptVar1[4].succ.
            super__Deque_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
            ptVar1[4].succ.
            super__Deque_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur) goto LAB_0012a89c;
        ptVar5 = ptVar1 + 4;
LAB_0012a91f:
        prVar4 = (this->_roots).c.
                 super__Deque_base<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t,_std::allocator<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (prVar4 == (this->_roots).c.
                      super__Deque_base<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t,_std::allocator<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_first) {
          prVar4 = (this->_roots).c.
                   super__Deque_base<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t,_std::allocator<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0xc;
        }
        if (prVar4[-1].n._t == (ptVar5->n)._t) {
          close_scc(this,&ptVar5->n);
        }
        std::
        deque<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::todo_stack_entry_t,_std::allocator<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::todo_stack_entry_t>_>
        ::pop_back(&(this->_todo).c);
      }
      else {
        if (ptVar5[-1].succ.
            super__Deque_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            ptVar5[-1].succ.
            super__Deque_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur) {
          ptVar5 = ptVar5 + -1;
          goto LAB_0012a91f;
        }
LAB_0012a89c:
        todo_stack_entry_t::pick_successor((todo_stack_entry_t *)&stack0xffffffffffffffc0);
        if ((node_t *)local_40._t == (node_t *)0x0) {
LAB_0012a984:
          __assert_fail("_t != nullptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/shared_objects.hh"
                        ,0x1db,
                        "T *tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t, tchecker::tck_liveness::zg_couvscc::edge_t>>>::operator->() const [T = tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t, tchecker::tck_liveness::zg_couvscc::edge_t>>]"
                       );
        }
        puVar2 = couvscc::node_t::dfsnum((node_t *)local_40._t);
        if (*puVar2 == 0) {
          push(this,&stack0xffffffffffffffc0,ts,graph,stats);
        }
        else {
          if ((node_t *)local_40._t == (node_t *)0x0) goto LAB_0012a984;
          pbVar3 = couvscc::node_t::current((node_t *)local_40._t);
          if (*pbVar3 == true) {
            merge_scc(this,&stack0xffffffffffffffc0,stats,local_38);
            pbVar3 = stats_t::cycle(stats);
            if (*pbVar3 != false) {
              intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
              ::~intrusive_shared_ptr_t(&stack0xffffffffffffffc0);
              return;
            }
          }
        }
        intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
        ::~intrusive_shared_ptr_t
                  ((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
                    *)&stack0xffffffffffffffc0);
      }
      ptVar5 = (this->_todo).c.
               super__Deque_base<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::todo_stack_entry_t,_std::allocator<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::todo_stack_entry_t>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    } while (ptVar5 != (this->_todo).c.
                       super__Deque_base<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::todo_stack_entry_t,_std::allocator<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::todo_stack_entry_t>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  return;
}

Assistant:

void couv_dfs(node_sptr_t & n, TS & ts, GRAPH & graph, boost::dynamic_bitset<> const & labels,
                tchecker::algorithms::couvscc::stats_t & stats)
  {
    push(n, ts, graph, stats);
    while (!_todo.empty()) {
      auto && [n, succ] = _todo.top();
      if (succ.empty()) {
        if (_roots.top().n == n)
          close_scc(n);
        _todo.pop();
      }
      else {
        node_sptr_t t = _todo.top().pick_successor();
        if (t->dfsnum() == 0)
          push(t, ts, graph, stats);
        else if (t->current()) {
          merge_scc(t, stats, labels);
          if (stats.cycle())
            break;
        }
      }
    }
  }